

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SurfacePlatformAppearance.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::SurfacePlatformAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SurfacePlatformAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KINT32 Value_02;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  SurfacePlatformAppearance *local_18;
  SurfacePlatformAppearance *this_local;
  
  local_18 = this;
  this_local = (SurfacePlatformAppearance *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Surface Platform Appearance:");
  poVar1 = std::operator<<(poVar1,"\n\tPaint Scheme:           ");
  ENUMS::GetEnumAsStringPaintScheme_abi_cxx11_(&local_1d0,(ENUMS *)(ulong)((uint)*this & 1),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tMobility Kill:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 1 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tDamage:                 ");
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n\tSmoke:                  ");
  ENUMS::GetEnumAsStringEntitySmoke_abi_cxx11_
            (&local_210,(ENUMS *)(ulong)((uint)*this >> 5 & 3),Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\n\tTrailing Effect:        ");
  ENUMS::GetEnumAsStringEntityTrailingEffect_abi_cxx11_
            (&local_230,(ENUMS *)(ulong)((uint)*this >> 7 & 3),Value_02);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"\n\tRunning Lights:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xc & 1);
  poVar1 = std::operator<<(poVar1,"\n\tFlaming Effect:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xf & 1);
  poVar1 = std::operator<<(poVar1,"\n\tFrozen Status:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x15 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tPower Plant:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x16 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tState:                  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x17 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tSpot Lights:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1c & 1);
  poVar1 = std::operator<<(poVar1,"\n\tInterior Lights:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1d & 1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString SurfacePlatformAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Surface Platform Appearance:"
       << "\n\tPaint Scheme:           " << GetEnumAsStringPaintScheme( m_PaintScheme )
	   << "\n\tMobility Kill:          " << m_MobilityKill       
       << "\n\tDamage:                 " << GetEnumAsStringEntityDamage( m_Damage )
       << "\n\tSmoke:                  " << GetEnumAsStringEntitySmoke( m_Smoke )
       << "\n\tTrailing Effect:        " << GetEnumAsStringEntityTrailingEffect( m_TrailingEffect )  
	   << "\n\tRunning Lights:         " << m_RunningLights
       << "\n\tFlaming Effect:         " << m_FlamingEffectField		
       << "\n\tFrozen Status:          " << m_FrozenStatus
       << "\n\tPower Plant:            " << m_PowerPlantStatus
       << "\n\tState:                  " << m_State
	   << "\n\tSpot Lights:            " << m_SpotLights
	   << "\n\tInterior Lights:        " << m_InteriorLights
       << "\n";

    return ss.str();
}